

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_netstd_union_definition
          (t_netstd_generator *this,ostream *out,t_struct *tunion)

{
  t_program *program;
  t_struct *ptVar1;
  t_struct *out_00;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  t_type *ptVar6;
  string *psVar7;
  undefined4 extraout_var_03;
  reference pptVar8;
  string local_868;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_848
  ;
  t_field **local_840;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  allocator local_791;
  string local_790;
  undefined1 local_770 [8];
  t_struct undefined_struct;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  undefined1 local_4e8 [8];
  string copy_op_2;
  const_iterator cStack_4c0;
  bool needs_typecast_2;
  t_field **local_4b8;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  undefined1 local_370 [8];
  string copy_op_1;
  const_iterator cStack_348;
  bool needs_typecast_1;
  t_field **local_340;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  undefined1 local_238 [8];
  string copy_op;
  const_iterator cStack_210;
  bool needs_typecast;
  t_field **local_208;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_160
  ;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_40;
  t_struct *local_20;
  t_struct *tunion_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  local_20 = tunion;
  tunion_local = (t_struct *)out;
  out_local = (ostream *)this;
  start_netstd_namespace(this,out);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_40);
  poVar5 = std::operator<<(poVar5,"public abstract partial class ");
  iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var,iVar3));
  poVar5 = std::operator<<(poVar5," : TUnionBase");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_70);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_90);
  poVar5 = std::operator<<(poVar5,
                           "public abstract global::System.Threading.Tasks.Task WriteAsync(TProtocol tProtocol, CancellationToken "
                          );
  poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,");");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_b0);
  poVar5 = std::operator<<(poVar5,"public readonly int Isset;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_d0);
  poVar5 = std::operator<<(poVar5,"public abstract object Data { get; }");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_f0);
  poVar5 = std::operator<<(poVar5,"protected ");
  iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_00,iVar3));
  poVar5 = std::operator<<(poVar5,"(int isset)");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_110);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_130);
  poVar5 = std::operator<<(poVar5,"Isset = isset;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_130);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_((string *)&fields,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&fields);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&fields);
  f_iter._M_current = (t_field **)t_struct::get_members(local_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_160);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_180);
  poVar5 = std::operator<<(poVar5,"public override bool Equals(object that)");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_180);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)tunion_local);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_1a0);
  poVar5 = std::operator<<(poVar5,"if (!(that is ");
  iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_01,iVar3));
  poVar5 = std::operator<<(poVar5," other)) return false;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1a0);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_1c0,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_1c0);
  poVar5 = std::operator<<(poVar5,"if (ReferenceEquals(this, other)) return true;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::operator<<((ostream *)tunion_local,(string *)&::endl_abi_cxx11_);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_1e0);
  poVar5 = std::operator<<(poVar5,"if(this.Isset != other.Isset) return false;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::operator<<((ostream *)tunion_local,(string *)&::endl_abi_cxx11_);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_200,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_200);
  poVar5 = std::operator<<(poVar5,"switch (Isset)");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_200);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)tunion_local);
  local_208 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_160._M_current = local_208;
  while( true ) {
    cStack_210 = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_160,&stack0xfffffffffffffdf0);
    ptVar1 = tunion_local;
    if (!bVar2) break;
    copy_op.field_2._M_local_buf[0xf] = '\0';
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_160);
    ptVar6 = t_field::get_type(*pptVar8);
    get_deep_copy_method_call_abi_cxx11_
              ((string *)local_238,this,ptVar6,(bool *)(copy_op.field_2._M_local_buf + 0xf));
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_(&local_258,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_258);
    poVar5 = std::operator<<(poVar5,"case ");
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_160);
    iVar4 = t_field::get_key(*pptVar8);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    poVar5 = std::operator<<(poVar5,":");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_258);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_278);
    poVar5 = std::operator<<(poVar5,"return Equals(As_");
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_160);
    psVar7 = t_field::get_name_abi_cxx11_(*pptVar8);
    poVar5 = std::operator<<(poVar5,(string *)psVar7);
    poVar5 = std::operator<<(poVar5,", other.As_");
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_160);
    psVar7 = t_field::get_name_abi_cxx11_(*pptVar8);
    poVar5 = std::operator<<(poVar5,(string *)psVar7);
    poVar5 = std::operator<<(poVar5,");");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_278);
    t_generator::indent_down((t_generator *)this);
    std::__cxx11::string::~string((string *)local_238);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_160);
  }
  t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_298);
  poVar5 = std::operator<<(poVar5,"default:");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_298);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_2b8);
  poVar5 = std::operator<<(poVar5,"return true;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2b8);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_down((t_generator *)this);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)tunion_local);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)tunion_local);
  std::operator<<((ostream *)tunion_local,(string *)&::endl_abi_cxx11_);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_2d8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_2d8);
  poVar5 = std::operator<<(poVar5,"public override int GetHashCode()");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2d8);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_2f8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_2f8);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2f8);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_318,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_318);
  poVar5 = std::operator<<(poVar5,"switch (Isset)");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_318);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_338,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_338);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_338);
  t_generator::indent_up((t_generator *)this);
  local_340 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_160._M_current = local_340;
  while( true ) {
    cStack_348 = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_160,&stack0xfffffffffffffcb8);
    ptVar1 = tunion_local;
    if (!bVar2) break;
    copy_op_1.field_2._M_local_buf[0xf] = '\0';
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_160);
    ptVar6 = t_field::get_type(*pptVar8);
    get_deep_copy_method_call_abi_cxx11_
              ((string *)local_370,this,ptVar6,(bool *)(copy_op_1.field_2._M_local_buf + 0xf));
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_(&local_390,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_390);
    poVar5 = std::operator<<(poVar5,"case ");
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_160);
    iVar4 = t_field::get_key(*pptVar8);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    poVar5 = std::operator<<(poVar5,":");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_390);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_(&local_3b0,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_3b0);
    poVar5 = std::operator<<(poVar5,"return As_");
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_160);
    psVar7 = t_field::get_name_abi_cxx11_(*pptVar8);
    poVar5 = std::operator<<(poVar5,(string *)psVar7);
    poVar5 = std::operator<<(poVar5,".GetHashCode();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3b0);
    t_generator::indent_down((t_generator *)this);
    std::__cxx11::string::~string((string *)local_370);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_160);
  }
  t_generator::indent_abi_cxx11_(&local_3d0,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_3d0);
  poVar5 = std::operator<<(poVar5,"default:");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3d0);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_3f0,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_3f0);
  poVar5 = std::operator<<(poVar5,"return (new ___undefined()).GetHashCode();");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3f0);
  t_generator::indent_down((t_generator *)this);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_410,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_410);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_410);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_430,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_430);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_430);
  ptVar1 = tunion_local;
  if ((this->suppress_deepcopy & 1U) == 0) {
    t_generator::indent_abi_cxx11_(&local_450,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_450);
    poVar5 = std::operator<<(poVar5,"public ");
    iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_02,iVar3));
    poVar5 = std::operator<<(poVar5," DeepCopy()");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_450);
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_(&local_470,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_470);
    poVar5 = std::operator<<(poVar5,"{");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_470);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_(&local_490,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_490);
    poVar5 = std::operator<<(poVar5,"switch (Isset)");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_490);
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_(&local_4b0,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_4b0);
    poVar5 = std::operator<<(poVar5,"{");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_4b0);
    t_generator::indent_up((t_generator *)this);
    local_4b8 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_160._M_current = local_4b8;
    while( true ) {
      cStack_4c0 = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_160,&stack0xfffffffffffffb40);
      ptVar1 = tunion_local;
      if (!bVar2) break;
      copy_op_2.field_2._M_local_buf[0xf] = '\0';
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_160);
      ptVar6 = t_field::get_type(*pptVar8);
      get_deep_copy_method_call_abi_cxx11_
                ((string *)local_4e8,this,ptVar6,(bool *)(copy_op_2.field_2._M_local_buf + 0xf));
      ptVar1 = tunion_local;
      t_generator::indent_abi_cxx11_(&local_508,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_508);
      poVar5 = std::operator<<(poVar5,"case ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_160);
      iVar4 = t_field::get_key(*pptVar8);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
      poVar5 = std::operator<<(poVar5,":");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_508);
      t_generator::indent_up((t_generator *)this);
      ptVar1 = tunion_local;
      t_generator::indent_abi_cxx11_(&local_528,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_528);
      poVar5 = std::operator<<(poVar5,"return new ");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_160);
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar8);
      poVar5 = std::operator<<(poVar5,(string *)psVar7);
      poVar5 = std::operator<<(poVar5,"(As_");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_160);
      psVar7 = t_field::get_name_abi_cxx11_(*pptVar8);
      poVar5 = std::operator<<(poVar5,(string *)psVar7);
      poVar5 = std::operator<<(poVar5,(string *)local_4e8);
      poVar5 = std::operator<<(poVar5,");");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_528);
      t_generator::indent_down((t_generator *)this);
      std::__cxx11::string::~string((string *)local_4e8);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_160);
    }
    t_generator::indent_abi_cxx11_(&local_548,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_548);
    poVar5 = std::operator<<(poVar5,"default:");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_548);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_(&local_568,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_568);
    poVar5 = std::operator<<(poVar5,"return new ___undefined();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_568);
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_(&local_588,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_588);
    poVar5 = std::operator<<(poVar5,"}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_588);
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_(&local_5a8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_5a8);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_5a8);
  }
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_5c8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_5c8);
  poVar5 = std::operator<<(poVar5,"public class ___undefined : ");
  iVar3 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var_03,iVar3));
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_5c8);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_5e8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_5e8);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_5e8);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_608,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_608);
  poVar5 = std::operator<<(poVar5,"public override object Data { get { return null; } }");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_628,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_628);
  poVar5 = std::operator<<(poVar5,"public ___undefined() : base(0) {}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_608);
  ptVar1 = tunion_local;
  if ((this->suppress_deepcopy & 1U) == 0) {
    t_generator::indent_abi_cxx11_(&local_648,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_648);
    poVar5 = std::operator<<(poVar5,"public new ___undefined DeepCopy()");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_648);
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_(&local_668,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_668);
    poVar5 = std::operator<<(poVar5,"{");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_668);
    t_generator::indent_up((t_generator *)this);
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_(&local_688,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_688);
    poVar5 = std::operator<<(poVar5,"return new ___undefined();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_688);
    t_generator::indent_down((t_generator *)this);
    ptVar1 = tunion_local;
    t_generator::indent_abi_cxx11_((string *)&undefined_struct.xsd_all_,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)ptVar1,(string *)&undefined_struct.xsd_all_);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&undefined_struct.xsd_all_);
  }
  program = (this->super_t_oop_generator).super_t_generator.program_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_790,"___undefined",&local_791);
  t_struct::t_struct((t_struct *)local_770,program,&local_790);
  std::__cxx11::string::~string((string *)&local_790);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  generate_netstd_struct_equals(this,(ostream *)tunion_local,(t_struct *)local_770);
  generate_netstd_struct_hashcode(this,(ostream *)tunion_local,(t_struct *)local_770);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_7b8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_7b8);
  poVar5 = std::operator<<(poVar5,
                           "public override global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken "
                          );
  poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,")");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_7d8,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_7d8);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_7b8);
  t_generator::indent_up((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_7f8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_7f8);
  poVar5 = std::operator<<(poVar5,
                           "throw new TProtocolException( TProtocolException.INVALID_DATA, \"Cannot persist an union type which is not set.\");"
                          );
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_7f8);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_818,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_818);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_818);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_838,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_838);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_838);
  local_840 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_160._M_current = local_840;
  while( true ) {
    local_848._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_160,&local_848);
    out_00 = tunion_local;
    ptVar1 = local_20;
    if (!bVar2) break;
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_160);
    generate_netstd_union_class(this,(ostream *)out_00,ptVar1,*pptVar8);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_160);
  }
  generate_netstd_union_reader(this,(ostream *)tunion_local,local_20);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tunion_local;
  t_generator::indent_abi_cxx11_(&local_868,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)ptVar1,(string *)&local_868);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_868);
  end_netstd_namespace(this,(ostream *)tunion_local);
  t_struct::~t_struct((t_struct *)local_770);
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_union_definition(ostream& out, t_struct* tunion)
{
    // Let's define the class first
    start_netstd_namespace(out);

    out << indent() << "public abstract partial class " << tunion->get_name() << " : TUnionBase" << endl;
    out << indent() << "{" << endl;
    indent_up();

    out << indent() << "public abstract global::System.Threading.Tasks.Task WriteAsync(TProtocol tProtocol, CancellationToken " << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "public readonly int Isset;" << endl
        << indent() << "public abstract object Data { get; }" << endl
        << indent() << "protected " << tunion->get_name() << "(int isset)" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "Isset = isset;" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;

    const vector<t_field*>& fields = tunion->get_members();
    vector<t_field*>::const_iterator f_iter;

    out << indent() << "public override bool Equals(object that)" << endl;
    scope_up(out);
    out << indent() << "if (!(that is " << tunion->get_name() << " other)) return false;" << endl;
    out << indent() << "if (ReferenceEquals(this, other)) return true;" << endl;
    out << endl;
    out << indent() << "if(this.Isset != other.Isset) return false;" << endl;
    out << endl;
    out << indent() << "switch (Isset)" << endl;
    scope_up(out);
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        bool needs_typecast = false;
        string copy_op = get_deep_copy_method_call((*f_iter)->get_type(), needs_typecast);
        out << indent() << "case " << (*f_iter)->get_key() << ":" << endl;
        indent_up();
        out << indent() << "return Equals(As_" << (*f_iter)->get_name() << ", other.As_" << (*f_iter)->get_name() << ");" << endl;
        indent_down();
    }
    out << indent() << "default:" << endl;
    indent_up();
    out << indent() << "return true;" << endl;
    indent_down();
    indent_down();
    scope_down(out);
    scope_down(out);
    out << endl;

    out << indent() << "public override int GetHashCode()" << endl;
    out << indent() << "{" << endl;
    indent_up();
    out << indent() << "switch (Isset)" << endl;
    out << indent() << "{" << endl;
    indent_up();
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        bool needs_typecast = false;
        string copy_op = get_deep_copy_method_call((*f_iter)->get_type(), needs_typecast);
        out << indent() << "case " << (*f_iter)->get_key() << ":" << endl;
        indent_up();
        out << indent() << "return As_" << (*f_iter)->get_name() << ".GetHashCode();" << endl;
        indent_down();
    }
    out << indent() << "default:" << endl;
    indent_up();
    out << indent() << "return (new ___undefined()).GetHashCode();" << endl;
    indent_down();
    indent_down();
    out << indent() << "}" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;

    if( ! suppress_deepcopy) {
        out << indent() << "public " << tunion->get_name() << " DeepCopy()" << endl;
        out << indent() << "{" << endl;
        indent_up();
        out << indent() << "switch (Isset)" << endl;
        out << indent() << "{" << endl;
        indent_up();
        for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
        {
            bool needs_typecast = false;
            string copy_op = get_deep_copy_method_call((*f_iter)->get_type(), needs_typecast);
            out << indent() << "case " << (*f_iter)->get_key() << ":" << endl;
            indent_up();
            out << indent() << "return new " << (*f_iter)->get_name() << "(As_" << (*f_iter)->get_name() << copy_op << ");" << endl;
            indent_down();
        }
        out << indent() << "default:" << endl;
        indent_up();
        out << indent() << "return new ___undefined();" << endl;
        indent_down();
        indent_down();
        out << indent() << "}" << endl;
        indent_down();
        out << indent() << "}" << endl << endl;
    }

    out << indent() << "public class ___undefined : " << tunion->get_name() << endl;
    out << indent() << "{" << endl;
    indent_up();

    out << indent() << "public override object Data { get { return null; } }" << endl
        << indent() << "public ___undefined() : base(0) {}" << endl << endl;

    if( ! suppress_deepcopy) {
        out << indent() << "public new ___undefined DeepCopy()" << endl;
        out << indent() << "{" << endl;
        indent_up();
        out << indent() << "return new ___undefined();" << endl;
        indent_down();
        out << indent() << "}" << endl << endl;
    }

    t_struct undefined_struct(program_,"___undefined");
    generate_netstd_struct_equals(out, &undefined_struct);
    generate_netstd_struct_hashcode(out, &undefined_struct);

    out << indent() << "public override global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "throw new TProtocolException( TProtocolException.INVALID_DATA, \"Cannot persist an union type which is not set.\");" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;
    indent_down();
    out << indent() << "}" << endl << endl;

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        generate_netstd_union_class(out, tunion, (*f_iter));
    }

    generate_netstd_union_reader(out, tunion);

    indent_down();
    out << indent() << "}" << endl << endl;

    end_netstd_namespace(out);
}